

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsDiurnal_kry.c
# Opt level: O0

int main(void)

{
  int iVar1;
  undefined4 uVar2;
  int iVar3;
  undefined8 uVar4;
  UserData data_00;
  UserData data_01;
  undefined8 in_R8;
  undefined8 in_R9;
  int retval;
  int iout;
  void *cvode_mem;
  SUNLinearSolver LS;
  UserData data;
  N_Vector u;
  sunrealtype tout;
  sunrealtype t;
  sunrealtype reltol;
  sunrealtype abstol;
  SUNContext sunctx;
  int in_stack_ffffffffffffffac;
  char *funcname;
  void *pvVar5;
  sunrealtype in_stack_ffffffffffffffd0;
  double t_00;
  N_Vector in_stack_ffffffffffffffd8;
  N_Vector in_stack_ffffffffffffffe0;
  void *cvode_mem_00;
  undefined8 local_10;
  int local_4;
  
  local_4 = 0;
  pvVar5 = (void *)0x0;
  funcname = (char *)0x0;
  SUNContext_Create(0,&local_10);
  iVar1 = check_retval(pvVar5,funcname,in_stack_ffffffffffffffac);
  if (iVar1 == 0) {
    uVar4 = N_VNew_Serial(200,local_10);
    iVar1 = check_retval(pvVar5,funcname,in_stack_ffffffffffffffac);
    if (iVar1 == 0) {
      data_00 = AllocUserData();
      iVar1 = check_retval(pvVar5,funcname,in_stack_ffffffffffffffac);
      if (iVar1 == 0) {
        InitUserData(data_00);
        SetInitialProfiles(in_stack_ffffffffffffffe0,(sunrealtype)in_stack_ffffffffffffffd8,
                           in_stack_ffffffffffffffd0);
        cvode_mem_00 = (void *)0x3ee4f8b588e368f1;
        data_01 = (UserData)CVodeCreate(2,local_10);
        iVar1 = check_retval(pvVar5,(char *)data_01,in_stack_ffffffffffffffac);
        if (iVar1 == 0) {
          CVodeSetUserData(data_01,data_00);
          iVar1 = check_retval(pvVar5,(char *)data_01,in_stack_ffffffffffffffac);
          if (iVar1 == 0) {
            CVodeInit(0,data_01,f,uVar4);
            iVar1 = check_retval(pvVar5,(char *)data_01,in_stack_ffffffffffffffac);
            if (iVar1 == 0) {
              uVar2 = CVodeSStolerances(cvode_mem_00,0x3f50624dd2f1a9fc,data_01);
              iVar1 = check_retval(pvVar5,(char *)data_01,in_stack_ffffffffffffffac);
              if (iVar1 == 0) {
                pvVar5 = (void *)SUNLinSol_SPGMR(uVar4,1,0,local_10,in_R8,in_R9,uVar2);
                iVar1 = check_retval(pvVar5,(char *)data_01,in_stack_ffffffffffffffac);
                if (iVar1 == 0) {
                  CVodeSetLinearSolver(data_01,pvVar5,0);
                  iVar1 = check_retval(pvVar5,(char *)data_01,in_stack_ffffffffffffffac);
                  if (iVar1 == 0) {
                    CVodeSetJacTimes(data_01,0,jtv);
                    iVar1 = check_retval(pvVar5,(char *)data_01,in_stack_ffffffffffffffac);
                    if (iVar1 == 0) {
                      uVar2 = CVodeSetPreconditioner(data_01,Precond,PSolve);
                      iVar1 = check_retval(pvVar5,(char *)data_01,in_stack_ffffffffffffffac);
                      if (iVar1 == 0) {
                        printf(" \n2-species diurnal advection-diffusion problem\n\n");
                        t_00 = 7200.0;
                        for (iVar1 = 1; iVar1 < 0xd; iVar1 = iVar1 + 1) {
                          uVar2 = CVode(t_00,data_01,uVar4,&stack0xffffffffffffffd8,1,in_R8,in_R9,
                                        uVar2);
                          PrintOutput(cvode_mem_00,in_stack_ffffffffffffffd8,t_00);
                          iVar3 = check_retval(pvVar5,(char *)data_01,iVar1);
                          if (iVar3 != 0) break;
                          t_00 = t_00 + 7200.0;
                        }
                        PrintFinalStats(u);
                        N_VDestroy(uVar4);
                        FreeUserData(data_01);
                        CVodeFree(&stack0xffffffffffffffb0);
                        SUNLinSolFree(pvVar5);
                        SUNContext_Free(&local_10);
                        local_4 = 0;
                      }
                      else {
                        local_4 = 1;
                      }
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(void)
{
  SUNContext sunctx;
  sunrealtype abstol, reltol, t, tout;
  N_Vector u;
  UserData data;
  SUNLinearSolver LS;
  void* cvode_mem;
  int iout, retval;

  u         = NULL;
  data      = NULL;
  LS        = NULL;
  cvode_mem = NULL;

  /* Create the SUNDIALS simulation context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Allocate memory, and set problem data, initial values, tolerances */
  u = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)u, "N_VNew_Serial", 0)) { return (1); }
  data = AllocUserData();
  if (check_retval((void*)data, "AllocUserData", 2)) { return (1); }
  InitUserData(data);
  SetInitialProfiles(u, data->dx, data->dy);
  abstol = ATOL;
  reltol = RTOL;

  /* Call CVodeCreate to create the solver memory and specify the
   * Backward Differentiation Formula */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Set the pointer to user-defined data */
  retval = CVodeSetUserData(cvode_mem, data);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  /* Call CVodeInit to initialize the integrator memory and specify the
   * user's right hand side function in u'=f(t,u), the initial time T0, and
   * the initial dependent variable vector u. */
  retval = CVodeInit(cvode_mem, f, T0, u);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  /* Call CVodeSStolerances to specify the scalar relative tolerance
   * and scalar absolute tolerances */
  retval = CVodeSStolerances(cvode_mem, reltol, abstol);
  if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }

  /* Call SUNLinSol_SPGMR to specify the linear solver SUNLinSol_SPGMR
   * with left preconditioning and the default Krylov dimension */
  LS = SUNLinSol_SPGMR(u, SUN_PREC_LEFT, 0, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_SPGMR", 0)) { return (1); }

  /* Call CVodeSetLinearSolver to attach the linear solver to CVode */
  retval = CVodeSetLinearSolver(cvode_mem, LS, NULL);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return 1; }

  /* set the JAcobian-times-vector function */
  retval = CVodeSetJacTimes(cvode_mem, NULL, jtv);
  if (check_retval(&retval, "CVodeSetJacTimes", 1)) { return (1); }

  /* Set the preconditioner solve and setup functions */
  retval = CVodeSetPreconditioner(cvode_mem, Precond, PSolve);
  if (check_retval(&retval, "CVodeSetPreconditioner", 1)) { return (1); }

  /* In loop over output points, call CVode, print results, test for error */
  printf(" \n2-species diurnal advection-diffusion problem\n\n");
  for (iout = 1, tout = TWOHR; iout <= NOUT; iout++, tout += TWOHR)
  {
    retval = CVode(cvode_mem, tout, u, &t, CV_NORMAL);
    PrintOutput(cvode_mem, u, t);
    if (check_retval(&retval, "CVode", 1)) { break; }
  }

  PrintFinalStats(cvode_mem);

  /* Free memory */
  N_VDestroy(u);
  FreeUserData(data);
  CVodeFree(&cvode_mem);
  SUNLinSolFree(LS);
  SUNContext_Free(&sunctx);

  return (0);
}